

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# try-pattern-1.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int j;
  uint uVar4;
  int i;
  uint uVar5;
  
  for (uVar5 = 0; uVar5 != 9; uVar5 = uVar5 + 1) {
    for (uVar4 = 0; uVar4 != 9; uVar4 = uVar4 + 1) {
      uVar3 = uVar4;
      if (uVar4 < uVar5) {
        uVar3 = uVar5;
      }
      uVar2 = uVar4;
      if (uVar5 < uVar4) {
        uVar2 = uVar5;
      }
      iVar1 = uVar3 - 3;
      if (uVar5 + uVar4 < 9) {
        iVar1 = 5 - uVar2;
      }
      std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::operator<<((ostream *)&std::cout,' ');
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  return 0;
}

Assistant:

int main() {
  int A = 5;
  int B = (2 * A) - 1;
  for (int i = 0; i < B; i++) {
    for (int j = 0; j < B; j++) {
      if (i + j < B) {
        if (i <= j) {
          cout << A - i;
        } else {
          cout << A - j;
        }
      } else {
        if (i <= j) {
          cout << j - A + 2;
        } else {
          cout << i - A + 2;
        }
      }

      cout << ' ';
    }
    cout << endl;
  }
}